

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_fixed_wnaf_small_helper(int *wnaf,int *wnaf_expected,int w)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  secp256k1_scratch_space *scratch;
  ulong extraout_RAX;
  code *pcVar7;
  long lVar8;
  secp256k1_ge *psVar9;
  long extraout_RDX;
  ulong uVar10;
  secp256k1_ge *scratch_00;
  size_t sVar11;
  secp256k1_gej *r;
  secp256k1_strauss_point_state *psVar12;
  byte *out32;
  secp256k1_gej *psVar13;
  secp256k1_ge *b;
  secp256k1_gej *psVar14;
  secp256k1_gej *psVar15;
  code *cb;
  secp256k1_ge *cbdata;
  secp256k1_fe *unaff_R12;
  secp256k1_callback *error_callback;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar16;
  secp256k1_sha256 *psVar17;
  secp256k1_sha256 *hash;
  secp256k1_sha256 *psVar18;
  bool bVar19;
  ulong uStack_2380;
  secp256k1_strauss_state sStack_2370;
  secp256k1_strauss_point_state sStack_2358;
  secp256k1_fe asStack_1f48 [8];
  secp256k1_ge asStack_1dc8 [8];
  secp256k1_gej *psStack_1a80;
  secp256k1_callback *psStack_1a78;
  secp256k1_ge *psStack_1a68;
  secp256k1_strauss_point_state *psStack_1a60;
  secp256k1_scalar *psStack_1a58;
  undefined1 auStack_1a40 [8];
  undefined1 auStack_1a38 [176];
  secp256k1_gej sStack_1988;
  secp256k1_gej sStack_18f0;
  secp256k1_gej sStack_1858;
  secp256k1_gej sStack_17c0;
  secp256k1_gej sStack_1728;
  secp256k1_gej asStack_1690 [2];
  secp256k1_gej asStack_1510 [5];
  secp256k1_strauss_point_state sStack_11d0;
  secp256k1_scratch_space *psStack_db8;
  secp256k1_sha256 *psStack_db0;
  secp256k1_gej *psStack_da8;
  secp256k1_scalar *psStack_da0;
  secp256k1_gej *psStack_d98;
  code *pcStack_d90;
  undefined4 uStack_d86;
  undefined2 uStack_d82;
  long lStack_d80;
  byte abStack_d78 [32];
  secp256k1_scalar sStack_d58;
  secp256k1_sha256 sStack_d38;
  undefined1 auStack_cc8 [144];
  secp256k1_strauss_point_state *psStack_c38;
  undefined1 auStack_c30 [32];
  undefined1 auStack_c10 [40];
  secp256k1_ge *psStack_be8;
  secp256k1_strauss_point_state *psStack_be0;
  secp256k1_gej sStack_bd8;
  secp256k1_gej sStack_b40;
  secp256k1_gej sStack_aa8;
  secp256k1_ge sStack_a10;
  secp256k1_gej sStack_9a8;
  secp256k1_fe asStack_910 [8];
  secp256k1_ge asStack_790 [8];
  secp256k1_strauss_point_state sStack_450;
  
  uVar6 = 0x20;
  do {
    uVar4 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar4;
    if (wnaf[uVar6] != 0) {
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0014e825;
    }
  } while (8 < uVar4);
  uVar4 = 7;
  while (wnaf[uVar4] == wnaf_expected[uVar4]) {
    bVar19 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar19) {
      return;
    }
  }
LAB_0014e825:
  test_fixed_wnaf_small_helper_cold_2();
  psVar15 = (secp256k1_gej *)auStack_c30;
  psVar12 = (secp256k1_strauss_point_state *)((ulong)wnaf_expected & 0xffffffff);
  psVar16 = (secp256k1_scalar *)auStack_c10;
  psStack_c38 = (secp256k1_strauss_point_state *)0x14e84d;
  testutil_random_scalar_order_test(psVar16);
  psStack_c38 = (secp256k1_strauss_point_state *)0x14e85e;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c30,psVar16,(secp256k1_scalar *)wnaf);
  psStack_c38 = (secp256k1_strauss_point_state *)0x14e869;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c30,(secp256k1_scalar *)auStack_c30);
  if ((int)wnaf_expected == 0) {
    psStack_c38 = (secp256k1_strauss_point_state *)0x14e962;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_aa8,(secp256k1_scalar *)auStack_c10);
    psStack_c38 = (secp256k1_strauss_point_state *)0x14e979;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b40,(secp256k1_scalar *)auStack_c30);
    psStack_c38 = (secp256k1_strauss_point_state *)0x14e98d;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_bd8,(secp256k1_scalar *)wnaf);
  }
  else {
    psStack_c38 = (secp256k1_strauss_point_state *)0x14e881;
    testutil_random_ge_test(&sStack_a10);
    psStack_c38 = (secp256k1_strauss_point_state *)0x14e891;
    secp256k1_gej_set_ge(&sStack_9a8,&sStack_a10);
    if ((int)wnaf_expected == 1) {
      unaff_R12 = asStack_910;
      unaff_R13 = asStack_790;
      psVar12 = &sStack_450;
      psVar16 = &secp256k1_scalar_zero;
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e8f1;
      sStack_b40.x.n[0] = (uint64_t)unaff_R12;
      sStack_b40.x.n[1] = (uint64_t)unaff_R13;
      sStack_b40.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_b40,&sStack_aa8,1,&sStack_9a8,
                 (secp256k1_scalar *)auStack_c10,&secp256k1_scalar_zero);
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e91c;
      sStack_bd8.x.n[0] = (uint64_t)unaff_R12;
      sStack_bd8.x.n[1] = (uint64_t)unaff_R13;
      sStack_bd8.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_bd8,&sStack_b40,1,&sStack_9a8,
                 (secp256k1_scalar *)auStack_c30,&secp256k1_scalar_zero);
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e944;
      auStack_c10._32_8_ = unaff_R12;
      psStack_be8 = unaff_R13;
      psStack_be0 = psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_c10 + 0x20),&sStack_bd8,1,&sStack_9a8,
                 (secp256k1_scalar *)wnaf,&secp256k1_scalar_zero);
      psVar15 = &sStack_9a8;
    }
    else {
      psVar16 = (secp256k1_scalar *)&sStack_a10;
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e9ac;
      secp256k1_ecmult_const(&sStack_aa8,(secp256k1_ge *)psVar16,(secp256k1_scalar *)auStack_c10);
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e9bf;
      secp256k1_ecmult_const(&sStack_b40,(secp256k1_ge *)psVar16,(secp256k1_scalar *)auStack_c30);
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e9cf;
      secp256k1_ecmult_const(&sStack_bd8,(secp256k1_ge *)psVar16,(secp256k1_scalar *)wnaf);
      psVar15 = (secp256k1_gej *)auStack_c30;
    }
  }
  psStack_c38 = (secp256k1_strauss_point_state *)0x14e9e9;
  secp256k1_gej_add_var(&sStack_bd8,&sStack_bd8,&sStack_aa8,(secp256k1_fe *)0x0);
  psStack_c38 = (secp256k1_strauss_point_state *)0x14e9fe;
  psVar13 = &sStack_bd8;
  secp256k1_gej_add_var(&sStack_bd8,&sStack_bd8,&sStack_b40,(secp256k1_fe *)0x0);
  psStack_c38 = (secp256k1_strauss_point_state *)0x14ea06;
  psVar14 = &sStack_bd8;
  secp256k1_gej_verify(&sStack_bd8);
  if (sStack_bd8.infinity != 0) {
    return;
  }
  psStack_c38 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (byte *)((ulong)psVar14 & 0xffffffff);
  pcStack_d90 = (code *)0x14ea52;
  lStack_d80 = extraout_RDX;
  auStack_cc8._104_8_ = &sStack_bd8;
  auStack_cc8._112_8_ = unaff_R12;
  auStack_cc8._120_8_ = unaff_R13;
  auStack_cc8._128_8_ = psVar16;
  auStack_cc8._136_8_ = psVar15;
  psStack_c38 = psVar12;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_d86 = SUB84(psVar14,0);
  psVar15 = (secp256k1_gej *)auStack_cc8;
  auStack_cc8._0_8_ = 0xbb67ae856a09e667;
  auStack_cc8._8_8_ = 0xa54ff53a3c6ef372;
  auStack_cc8._16_8_ = 0x9b05688c510e527f;
  auStack_cc8._24_8_ = 0x5be0cd191f83d9ab;
  psVar17 = (secp256k1_sha256 *)0x0;
  auStack_cc8._96_8_ = 0;
  sStack_d58.d[0] = 0;
  sStack_d58.d[1] = 0;
  sStack_d58.d[2] = 0;
  sStack_d58.d[3] = 0;
  pcStack_d90 = (code *)0x14ea99;
  secp256k1_scalar_verify(&sStack_d58);
  pcStack_d90 = (code *)0x14eaa7;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar15,&sStack_d58,scratch);
  sStack_d58.d[0] = 1;
  sStack_d58.d[1] = 0;
  sStack_d58.d[2] = 0;
  sStack_d58.d[3] = 0;
  pcStack_d90 = (code *)0x14eac2;
  secp256k1_scalar_verify(&sStack_d58);
  pcStack_d90 = (code *)0x14ead0;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar15,&sStack_d58,scratch);
  pcStack_d90 = (code *)0x14eadb;
  secp256k1_scalar_negate(&sStack_d58,&sStack_d58);
  pcStack_d90 = (code *)0x14eae9;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar15,&sStack_d58,scratch);
  if (psVar13 != (secp256k1_gej *)0x0) {
    psVar15 = (secp256k1_gej *)0x0;
    psVar17 = &sStack_d38;
    out32 = abStack_d78;
    do {
      uStack_d82 = SUB82(psVar15,0);
      sStack_d38.s[0] = 0x6a09e667;
      sStack_d38.s[1] = 0xbb67ae85;
      sStack_d38.s[2] = 0x3c6ef372;
      sStack_d38.s[3] = 0xa54ff53a;
      sStack_d38.s[4] = 0x510e527f;
      sStack_d38.s[5] = 0x9b05688c;
      sStack_d38.s[6] = 0x1f83d9ab;
      sStack_d38.s[7] = 0x5be0cd19;
      sStack_d38.bytes = 0;
      pcStack_d90 = (code *)0x14eb40;
      secp256k1_sha256_write(psVar17,(uchar *)&uStack_d86,6);
      pcStack_d90 = (code *)0x14eb4b;
      secp256k1_sha256_finalize(psVar17,out32);
      pcStack_d90 = (code *)0x14eb58;
      secp256k1_scalar_set_b32(&sStack_d58,out32,(int *)0x0);
      pcStack_d90 = (code *)0x14eb6b;
      test_ecmult_accumulate((secp256k1_sha256 *)auStack_cc8,&sStack_d58,scratch);
      psVar15 = (secp256k1_gej *)((long)(psVar15->x).n + 1);
    } while (psVar13 != psVar15);
  }
  pcStack_d90 = (code *)0x14eb85;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_cc8,abStack_d78);
  lVar8 = 0;
  uVar6 = extraout_RAX;
  do {
    uVar10 = uVar6 & 0xffffffff;
    bVar2 = abStack_d78[lVar8];
    psVar9 = (secp256k1_ge *)(ulong)bVar2;
    bVar3 = *(byte *)(lStack_d80 + lVar8);
    hash = (secp256k1_sha256 *)(ulong)bVar3;
    uVar6 = (ulong)((uint)bVar2 - (uint)bVar3);
    if (bVar2 == bVar3) {
      uVar6 = uVar10;
    }
    iVar5 = (int)uVar6;
    if (bVar2 != bVar3) goto LAB_0014ebaf;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  iVar5 = 0;
LAB_0014ebaf:
  if (iVar5 == 0) {
    pcStack_d90 = (code *)0x14ebc2;
    secp256k1_scratch_space_destroy(CTX,scratch);
    return;
  }
  pcStack_d90 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  auStack_1a40 = (undefined1  [8])0x41;
  psStack_1a58 = (secp256k1_scalar *)0x14ec12;
  psStack_db8 = scratch;
  psStack_db0 = psVar17;
  psStack_da8 = psVar15;
  psStack_da0 = &sStack_d58;
  psStack_d98 = psVar13;
  pcStack_d90 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1858,&secp256k1_ge_const_g);
  psStack_1a58 = (secp256k1_scalar *)0x14ec1f;
  secp256k1_gej_set_infinity(&sStack_18f0);
  psStack_1a58 = (secp256k1_scalar *)0x14ec36;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_17c0 + 1,(secp256k1_scalar *)psVar9);
  psVar12 = (secp256k1_strauss_point_state *)(asStack_1510[5].y.n + 3);
  psStack_1a58 = (secp256k1_scalar *)0x14ec88;
  sStack_1988.x.n[0] = (uint64_t)asStack_1690;
  sStack_1988.x.n[1] = (uint64_t)asStack_1510;
  sStack_1988.x.n[2] = (uint64_t)psVar12;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1988,&sStack_17c0,1,&sStack_1858,
             (secp256k1_scalar *)psVar9,&secp256k1_scalar_zero);
  psStack_1a58 = (secp256k1_scalar *)0x14ecb8;
  auStack_1a38._0_8_ = asStack_1690;
  auStack_1a38._8_8_ = asStack_1510;
  auStack_1a38._16_8_ = psVar12;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1a38,&sStack_1988,1,&sStack_18f0,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar9);
  error_callback = (secp256k1_callback *)0xd0;
  psVar15 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_ge *)0x0;
  psStack_1a58 = (secp256k1_scalar *)0x14ece9;
  psVar16 = (secp256k1_scalar *)psVar9;
  b = scratch_00;
  iVar5 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar15,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1510[5].y.n + 3),(secp256k1_scalar *)psVar9,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar5 == 0) {
    psStack_1a58 = (secp256k1_scalar *)0x14ee4c;
    test_ecmult_accumulate_cold_8();
LAB_0014ee4c:
    psStack_1a58 = (secp256k1_scalar *)0x14ee51;
    test_ecmult_accumulate_cold_7();
LAB_0014ee51:
    psStack_1a58 = (secp256k1_scalar *)0x14ee56;
    test_ecmult_accumulate_cold_6();
LAB_0014ee56:
    psStack_1a58 = (secp256k1_scalar *)0x14ee5b;
    test_ecmult_accumulate_cold_5();
LAB_0014ee5b:
    psStack_1a58 = (secp256k1_scalar *)0x14ee60;
    test_ecmult_accumulate_cold_4();
LAB_0014ee60:
    psStack_1a58 = (secp256k1_scalar *)0x14ee65;
    test_ecmult_accumulate_cold_3();
LAB_0014ee65:
    psStack_1a58 = (secp256k1_scalar *)0x14ee6a;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar16 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1a58 = (secp256k1_scalar *)0x14ed24;
    b = scratch_00;
    psVar15 = (secp256k1_gej *)error_callback;
    cbdata = psVar9;
    iVar5 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1510,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar9,1);
    if (iVar5 == 0) goto LAB_0014ee4c;
    psStack_1a58 = (secp256k1_scalar *)0x14ed43;
    secp256k1_ecmult_const(asStack_1690,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar9);
    psVar9 = (secp256k1_ge *)auStack_1a38;
    psStack_1a58 = (secp256k1_scalar *)0x14ed58;
    secp256k1_ge_set_gej_var(psVar9,&sStack_17c0 + 1);
    psVar15 = &sStack_17c0;
    psStack_1a58 = (secp256k1_scalar *)0x14ed68;
    b = psVar9;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,psVar9);
    if (iVar5 == 0) goto LAB_0014ee51;
    psVar15 = &sStack_1988;
    b = (secp256k1_ge *)auStack_1a38;
    psStack_1a58 = (secp256k1_scalar *)0x14ed82;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,b);
    if (iVar5 == 0) goto LAB_0014ee56;
    psVar15 = (secp256k1_gej *)(asStack_1510[5].y.n + 3);
    b = (secp256k1_ge *)auStack_1a38;
    psStack_1a58 = (secp256k1_scalar *)0x14ed9c;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,b);
    if (iVar5 == 0) goto LAB_0014ee5b;
    psVar15 = asStack_1510;
    b = (secp256k1_ge *)auStack_1a38;
    psStack_1a58 = (secp256k1_scalar *)0x14edb6;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,b);
    if (iVar5 == 0) goto LAB_0014ee60;
    psVar15 = asStack_1690;
    b = (secp256k1_ge *)auStack_1a38;
    psStack_1a58 = (secp256k1_scalar *)0x14edd0;
    iVar5 = secp256k1_gej_eq_ge_var(psVar15,b);
    if (iVar5 == 0) goto LAB_0014ee65;
    psStack_1a58 = (secp256k1_scalar *)0x14ede5;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1a38);
    if (auStack_1a38._96_4_ != 0) {
      auStack_1a38[0x68] = 0;
      sVar11 = 1;
LAB_0014ee2b:
      psStack_1a58 = (secp256k1_scalar *)0x14ee35;
      secp256k1_sha256_write(hash,auStack_1a38 + 0x68,sVar11);
      return;
    }
    psVar15 = (secp256k1_gej *)auStack_1a38;
    b = (secp256k1_ge *)(auStack_1a38 + 0x68);
    psVar9 = (secp256k1_ge *)auStack_1a40;
    psVar16 = (secp256k1_scalar *)0x0;
    psStack_1a58 = (secp256k1_scalar *)0x14ee1a;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar15,(uchar *)b,(size_t *)psVar9,0);
    if (auStack_1a40 == (undefined1  [8])0x41) {
      sVar11 = 0x41;
      goto LAB_0014ee2b;
    }
  }
  psStack_1a58 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_1a58 = &secp256k1_scalar_zero;
  psStack_1a80 = asStack_1690;
  psStack_1a78 = error_callback;
  psStack_1a68 = psVar9;
  psStack_1a60 = psVar12;
  secp256k1_gej_set_infinity(r);
  if ((secp256k1_ge *)psVar16 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash != (secp256k1_sha256 *)0x0) {
      if (b != (secp256k1_ge *)0x0) {
        sVar11 = secp256k1_pippenger_max_points
                           ((secp256k1_callback *)psVar15,(secp256k1_scratch *)b);
        psVar17 = hash;
        if (sVar11 != 0) {
          uVar6 = 5000000;
          if (sVar11 < 5000000) {
            uVar6 = sVar11;
          }
          puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
          uStack_2380 = (ulong)puVar1 / uVar6 + 1;
          psVar17 = (secp256k1_sha256 *)((ulong)puVar1 / uStack_2380 + 1);
        }
        if (sVar11 != 0) {
          if (psVar17 < (secp256k1_sha256 *)0x58) {
            sVar11 = secp256k1_scratch_max_allocation
                               ((secp256k1_callback *)psVar15,(secp256k1_scratch *)b,5);
            if (0x987 < sVar11) {
              uVar6 = sVar11 / 0x988;
              if (4999999 < uVar6) {
                uVar6 = 5000000;
              }
              puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
              uStack_2380 = (ulong)puVar1 / uVar6 + 1;
              psVar17 = (secp256k1_sha256 *)((ulong)puVar1 / uStack_2380 + 1);
            }
            if (sVar11 < 0x988) goto LAB_0014f00a;
            pcVar7 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar7 = secp256k1_ecmult_pippenger_batch;
          }
          lVar8 = 0;
          uVar6 = 0;
          while( true ) {
            psVar18 = psVar17;
            if (hash < psVar17) {
              psVar18 = hash;
            }
            psVar9 = (secp256k1_ge *)0x0;
            if (uVar6 == 0) {
              psVar9 = (secp256k1_ge *)psVar16;
            }
            iVar5 = (*pcVar7)(psVar15,b,&sStack_2358,psVar9,cb,cbdata,psVar18,lVar8);
            if (iVar5 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_2358,(secp256k1_fe *)0x0);
            hash = (secp256k1_sha256 *)((long)hash - (long)psVar18);
            uVar6 = uVar6 + 1;
            lVar8 = (long)psVar17->s + lVar8;
            if (uStack_2380 == uVar6) {
              return;
            }
          }
          return;
        }
      }
LAB_0014f00a:
      secp256k1_ecmult_multi_simple_var(r,psVar16,cb,cbdata,(size_t)hash);
      return;
    }
    sStack_2370.aux = asStack_1f48;
    sStack_2370.pre_a = asStack_1dc8;
    sStack_2370.ps = &sStack_2358;
    secp256k1_ecmult_strauss_wnaf(&sStack_2370,r,1,r,&secp256k1_scalar_zero,psVar16);
  }
  return;
}

Assistant:

static void test_fixed_wnaf_small_helper(int *wnaf, int *wnaf_expected, int w) {
    int i;
    for (i = WNAF_SIZE(w)-1; i >= 8; --i) {
        CHECK(wnaf[i] == 0);
    }
    for (i = 7; i >= 0; --i) {
        CHECK(wnaf[i] == wnaf_expected[i]);
    }
}